

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash_join_executor.cpp
# Opt level: O1

void __thiscall
duckdb::PerfectHashJoinExecutor::TemplatedFillSelectionVectorProbe<unsigned_long>
          (PerfectHashJoinExecutor *this,Vector *source,SelectionVector *build_sel_vec,
          SelectionVector *probe_sel_vec,idx_t count,idx_t *probe_sel_count)

{
  sel_t *psVar1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  sel_t *psVar3;
  sel_t *psVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  idx_t iVar7;
  ulong uVar8;
  idx_t iVar9;
  long lVar10;
  ulong uVar11;
  idx_t iVar12;
  UnifiedVectorFormat vector_data;
  UnifiedVectorFormat local_78;
  
  uVar5 = Value::GetValueUnsafe<unsigned_long>(&(this->perfect_join_statistics).build_min);
  uVar6 = Value::GetValueUnsafe<unsigned_long>(&(this->perfect_join_statistics).build_max);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(source,count,&local_78);
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      iVar7 = *probe_sel_count;
      psVar1 = (local_78.sel)->sel_vector;
      _Var2._M_head_impl =
           (this->bitmap_build_idx).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
           super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
           super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
           super__Head_base<0UL,_bool_*,_false>._M_head_impl;
      psVar3 = build_sel_vec->sel_vector;
      psVar4 = probe_sel_vec->sel_vector;
      iVar9 = 0;
      lVar10 = 0;
      do {
        iVar12 = iVar9;
        if (psVar1 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar1[iVar9];
        }
        uVar11 = *(ulong *)(local_78.data + iVar12 * 8);
        if ((uVar11 <= uVar6 && uVar5 <= uVar11) && (_Var2._M_head_impl[uVar11 - uVar5] == true)) {
          psVar3[lVar10] = (sel_t)(uVar11 - uVar5);
          psVar4[lVar10] = (sel_t)iVar9;
          lVar10 = lVar10 + 1;
          iVar7 = iVar7 + 1;
          *probe_sel_count = iVar7;
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
  }
  else if (count != 0) {
    iVar7 = *probe_sel_count;
    psVar1 = (local_78.sel)->sel_vector;
    _Var2._M_head_impl =
         (this->bitmap_build_idx).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    psVar3 = build_sel_vec->sel_vector;
    psVar4 = probe_sel_vec->sel_vector;
    lVar10 = 0;
    uVar11 = 0;
    do {
      uVar8 = uVar11;
      if (psVar1 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar1[uVar11];
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6] >>
           (uVar8 & 0x3f) & 1) != 0) {
        uVar8 = *(ulong *)(local_78.data + uVar8 * 8);
        if ((uVar8 <= uVar6 && uVar5 <= uVar8) && (_Var2._M_head_impl[uVar8 - uVar5] == true)) {
          psVar3[lVar10] = (sel_t)(uVar8 - uVar5);
          psVar4[lVar10] = (sel_t)uVar11;
          lVar10 = lVar10 + 1;
          iVar7 = iVar7 + 1;
          *probe_sel_count = iVar7;
        }
      }
      uVar11 = uVar11 + 1;
    } while (count != uVar11);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void PerfectHashJoinExecutor::TemplatedFillSelectionVectorProbe(Vector &source, SelectionVector &build_sel_vec,
                                                                SelectionVector &probe_sel_vec, idx_t count,
                                                                idx_t &probe_sel_count) {
	auto min_value = perfect_join_statistics.build_min.GetValueUnsafe<T>();
	auto max_value = perfect_join_statistics.build_max.GetValueUnsafe<T>();

	UnifiedVectorFormat vector_data;
	source.ToUnifiedFormat(count, vector_data);
	auto data = reinterpret_cast<T *>(vector_data.data);
	auto validity_mask = &vector_data.validity;
	// build selection vector for non-dense build
	if (validity_mask->AllValid()) {
		for (idx_t i = 0, sel_idx = 0; i < count; ++i) {
			// retrieve value from vector
			auto data_idx = vector_data.sel->get_index(i);
			auto input_value = data[data_idx];
			// add index to selection vector if value in the range
			if (min_value <= input_value && input_value <= max_value) {
				auto idx = (idx_t)(input_value - min_value); // subtract min value to get the idx position
				                                             // check for matches in the build
				if (bitmap_build_idx[idx]) {
					build_sel_vec.set_index(sel_idx, idx);
					probe_sel_vec.set_index(sel_idx++, i);
					probe_sel_count++;
				}
			}
		}
	} else {
		for (idx_t i = 0, sel_idx = 0; i < count; ++i) {
			// retrieve value from vector
			auto data_idx = vector_data.sel->get_index(i);
			if (!validity_mask->RowIsValid(data_idx)) {
				continue;
			}
			auto input_value = data[data_idx];
			// add index to selection vector if value in the range
			if (min_value <= input_value && input_value <= max_value) {
				auto idx = (idx_t)(input_value - min_value); // subtract min value to get the idx position
				                                             // check for matches in the build
				if (bitmap_build_idx[idx]) {
					build_sel_vec.set_index(sel_idx, idx);
					probe_sel_vec.set_index(sel_idx++, i);
					probe_sel_count++;
				}
			}
		}
	}
}